

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Vec4 *p)

{
  ostringstream msg;
  undefined1 auStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_188);
  if (*(float *)this <= -*(float *)(this + 0xc) && -*(float *)(this + 0xc) != *(float *)this) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(-X clip)",10);
  }
  if (*(float *)(this + 0xc) <= *(float *)this && *(float *)this != *(float *)(this + 0xc)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(+X clip)",10);
  }
  if (*(float *)(this + 4) <= -*(float *)(this + 0xc) &&
      -*(float *)(this + 0xc) != *(float *)(this + 4)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(-Y clip)",10);
  }
  if (*(float *)(this + 0xc) <= *(float *)(this + 4) &&
      *(float *)(this + 4) != *(float *)(this + 0xc)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(+Y clip)",10);
  }
  if (*(float *)(this + 8) <= -*(float *)(this + 0xc) &&
      -*(float *)(this + 0xc) != *(float *)(this + 8)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(-Z clip)",10);
  }
  if (*(float *)(this + 0xc) <= *(float *)(this + 8) &&
      *(float *)(this + 8) != *(float *)(this + 0xc)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(+Z clip)",10);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_188);
  std::ios_base::~ios_base((ios_base *)(auStack_188 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string genClippingPointInfoString(const tcu::Vec4& p)
{
	std::ostringstream msg;

	if (p.x() < -p.w())		msg << "\t(-X clip)";
	if (p.x() >  p.w())		msg << "\t(+X clip)";
	if (p.y() < -p.w())		msg << "\t(-Y clip)";
	if (p.y() >  p.w())		msg << "\t(+Y clip)";
	if (p.z() < -p.w())		msg << "\t(-Z clip)";
	if (p.z() >  p.w())		msg << "\t(+Z clip)";

	return msg.str();
}